

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

small_vector<int,_4UL,_0UL,_std::allocator<int>_> * __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator=
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,
          small_vector<int,_4UL,_0UL,_std::allocator<int>_> *v)

{
  int *piVar1;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RSI;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RDI;
  pointer p;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this_00;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    clear(in_stack_ffffffffffffffe0);
    size(in_RSI);
    piVar1 = choose_data(in_RSI,(size_t)in_stack_ffffffffffffffe0);
    in_RDI->m_end = piVar1;
    in_RDI->m_begin = piVar1;
    for (this_00 = (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)in_RSI->m_begin;
        this_00 != (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)in_RSI->m_end;
        this_00 = (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&this_00->field_0x4) {
      get_alloc(in_RDI);
      std::allocator_traits<std::allocator<int>>::construct<int,int&>
                ((allocator_type *)this_00,(int *)in_RDI,(int *)0x1e2556);
      in_RDI->m_end = in_RDI->m_end + 1;
    }
    update_capacity(this_00);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

small_vector& operator=(const small_vector& v)
    {
        if (this == &v)
        {
            // prevent self usurp
            return *this;
        }

        clear();

        m_begin = m_end = choose_data(v.size());

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }

        update_capacity();

        return *this;
    }